

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mockaron.cpp
# Opt level: O0

void __thiscall mockaron::detail::mock_impl::add_hook_(mock_impl *this,char *name,char *sig,any *h)

{
  mapped_type *this_00;
  allocator local_89;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  any *local_28;
  any *h_local;
  char *sig_local;
  char *name_local;
  mock_impl *this_local;
  
  local_28 = h;
  h_local = (any *)sig;
  sig_local = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,name,&local_89);
  std::operator+(local_68,(char *)local_88);
  std::operator+(local_48,(char *)local_68);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mockaron::detail::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mockaron::detail::any>_>_>
            ::operator[](&this->_methods,local_48);
  any::operator=(this_00,h);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return;
}

Assistant:

void mock_impl::add_hook_(char const* name, char const* sig, any h)
{
  _methods[std::string(name) + "##" + sig] = std::move(h);
}